

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O2

int Imf_3_4::anon_unknown_8::levelSize(int min,int max,int l,LevelRoundingMode levelRoundingMode)

{
  int iVar1;
  
  if (max < min) {
    return 0;
  }
  iVar1 = ((max - min) + 1) / (1 << ((byte)l & 0x1f));
  iVar1 = iVar1 + (uint)(iVar1 << ((byte)l & 0x1f) <= max - min && levelRoundingMode == ROUND_UP);
  if (iVar1 < 2) {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int
levelSize (int min, int max, int l, LevelRoundingMode levelRoundingMode)
{
    assert (l >= 0);

    if (max < min) return 0;

    int a    = max - min + 1;
    int b    = (1 << l);
    int size = a / b;

    if (levelRoundingMode == ROUND_UP && size * b < a) size += 1;

    return std::max (size, 1);
}